

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ItemSimilarityRecommender::Clear(ItemSimilarityRecommender *this)

{
  string *psVar1;
  Arena *pAVar2;
  ItemSimilarityRecommender *this_local;
  
  google::protobuf::RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>
  ::Clear(&this->itemitemsimilarities_);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::ClearToEmptyNoArena
            (&this->iteminputfeaturename_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::ClearToEmptyNoArena
            (&this->numrecommendationsinputfeaturename_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::ClearToEmptyNoArena
            (&this->itemrestrictioninputfeaturename_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::ClearToEmptyNoArena
            (&this->itemexclusioninputfeaturename_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::ClearToEmptyNoArena
            (&this->recommendeditemlistoutputfeaturename_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::ClearToEmptyNoArena
            (&this->recommendeditemscoreoutputfeaturename_,psVar1);
  pAVar2 = GetArenaNoVirtual(this);
  if (((pAVar2 == (Arena *)0x0) && (this->itemstringids_ != (StringVector *)0x0)) &&
     (this->itemstringids_ != (StringVector *)0x0)) {
    (*(this->itemstringids_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->itemstringids_ = (StringVector *)0x0;
  pAVar2 = GetArenaNoVirtual(this);
  if (((pAVar2 == (Arena *)0x0) && (this->itemint64ids_ != (Int64Vector *)0x0)) &&
     (this->itemint64ids_ != (Int64Vector *)0x0)) {
    (*(this->itemint64ids_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->itemint64ids_ = (Int64Vector *)0x0;
  return;
}

Assistant:

void ItemSimilarityRecommender::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.ItemSimilarityRecommender)
  itemitemsimilarities_.Clear();
  iteminputfeaturename_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  numrecommendationsinputfeaturename_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  itemrestrictioninputfeaturename_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  itemexclusioninputfeaturename_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  recommendeditemlistoutputfeaturename_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  recommendeditemscoreoutputfeaturename_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (GetArenaNoVirtual() == NULL && itemstringids_ != NULL) {
    delete itemstringids_;
  }
  itemstringids_ = NULL;
  if (GetArenaNoVirtual() == NULL && itemint64ids_ != NULL) {
    delete itemint64ids_;
  }
  itemint64ids_ = NULL;
}